

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::RasterizationSamplesInstance::verifyImage
          (TestStatus *__return_storage_ptr__,RasterizationSamplesInstance *this,
          ConstPixelBufferAccess *result)

{
  TextureFormat *this_00;
  bool bVar1;
  int surfaceWidth;
  int surfaceHeight;
  PrimitiveType PVar2;
  TestContext *pTVar3;
  MessageBuilder *pMVar4;
  InstanceInterface *pIVar5;
  VkPhysicalDevice pVVar6;
  TestLog *log_00;
  allocator<char> local_809;
  string local_808;
  uint local_7e8;
  allocator<char> local_7e1;
  string local_7e0;
  ConstPixelBufferAccess local_7c0;
  Vector<float,_4> local_798;
  Vector<float,_4> local_788;
  undefined1 local_778 [8];
  VkPhysicalDeviceProperties deviceProperties;
  undefined1 local_424 [8];
  RenderState renderState;
  ReferenceRenderer refRenderer;
  Program program;
  ColorFragmentShader fragmentShader;
  ColorVertexShader vertexShader;
  TextureFormat tcuDepthFormat;
  TextureFormat tcuColorFormat;
  MessageBuilder local_1b0;
  TestLog *local_30;
  TestLog *log;
  deUint32 minUniqueColors;
  deUint32 numUniqueColors;
  ConstPixelBufferAccess *result_local;
  RasterizationSamplesInstance *this_local;
  
  _minUniqueColors = result;
  result_local = (ConstPixelBufferAccess *)this;
  this_local = (RasterizationSamplesInstance *)__return_storage_ptr__;
  log._4_4_ = getUniqueColorsCount(result);
  log._0_4_ = 3;
  pTVar3 = Context::getTestContext((this->super_TestInstance).m_context);
  local_30 = tcu::TestContext::getLog(pTVar3);
  tcu::TestLog::operator<<(&local_1b0,local_30,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<
                     (&local_1b0,(char (*) [31])"\nMin. unique colors expected: ");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)&log);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x1387264);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [22])"Unique colors found: ");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)((long)&log + 4));
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x1387264);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  if (log._4_4_ < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&tcuColorFormat.type,"Unique colors out of expected bounds",
               (allocator<char> *)((long)&tcuColorFormat.order + 3));
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&tcuColorFormat.type);
    std::__cxx11::string::~string((string *)&tcuColorFormat.type);
    std::allocator<char>::~allocator((allocator<char> *)((long)&tcuColorFormat.order + 3));
  }
  else {
    tcuDepthFormat = ::vk::mapVkFormat(this->m_colorFormat);
    this_00 = (TextureFormat *)
              ((long)&vertexShader.super_VertexShader.m_outputs.
                      super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
    tcu::TextureFormat::TextureFormat(this_00);
    ColorVertexShader::ColorVertexShader((ColorVertexShader *)&fragmentShader.m_depthStencilFormat);
    ColorFragmentShader::ColorFragmentShader
              ((ColorFragmentShader *)&program.geometryShader,&tcuDepthFormat,this_00);
    rr::Program::Program
              ((Program *)&refRenderer.m_program,
               (VertexShader *)&fragmentShader.m_depthStencilFormat,
               (FragmentShader *)&program.geometryShader,(GeometryShader *)0x0);
    surfaceWidth = tcu::Vector<int,_2>::x(&this->m_renderSize);
    surfaceHeight = tcu::Vector<int,_2>::y(&this->m_renderSize);
    ReferenceRenderer::ReferenceRenderer
              ((ReferenceRenderer *)&renderState.restart.restartIndex,surfaceWidth,surfaceHeight,1,
               &tcuDepthFormat,
               (TextureFormat *)
               ((long)&vertexShader.super_VertexShader.m_outputs.
                       super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
               (Program *)&refRenderer.m_program);
    ReferenceRenderer::getViewportState
              ((ViewportState *)&deviceProperties.field_0x334,
               (ReferenceRenderer *)&renderState.restart.restartIndex);
    rr::RenderState::RenderState
              ((RenderState *)local_424,(ViewportState *)&deviceProperties.field_0x334,
               VIEWPORTORIENTATION_LOWER_LEFT);
    if (this->m_primitiveTopology == VK_PRIMITIVE_TOPOLOGY_POINT_LIST) {
      pIVar5 = Context::getInstanceInterface((this->super_TestInstance).m_context);
      pVVar6 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
      (*pIVar5->_vptr_InstanceInterface[5])(pIVar5,pVVar6,local_778);
      renderState.fragOps.colorMask.m_data =
           (bool  [4])deFloatMin(3.0,(float)deviceProperties.limits.discreteQueuePriorities);
    }
    if (this->m_modeFlags == 0) {
      tcu::Vector<float,_4>::Vector(&local_788,0.0);
      ReferenceRenderer::colorClear
                ((ReferenceRenderer *)&renderState.restart.restartIndex,&local_788);
      PVar2 = mapVkPrimitiveTopology(this->m_primitiveTopology);
      ReferenceRenderer::draw
                ((ReferenceRenderer *)&renderState.restart.restartIndex,(RenderState *)local_424,
                 PVar2,&this->m_vertices);
    }
    else {
      tcu::Vector<float,_4>::Vector(&local_798,1.0,0.0,0.0,1.0);
      ReferenceRenderer::colorClear
                ((ReferenceRenderer *)&renderState.restart.restartIndex,&local_798);
      PVar2 = mapVkPrimitiveTopology(this->m_primitiveTopology);
      ReferenceRenderer::draw
                ((ReferenceRenderer *)&renderState.restart.restartIndex,(RenderState *)local_424,
                 PVar2,&this->m_vertices);
    }
    pTVar3 = Context::getTestContext((this->super_TestInstance).m_context);
    log_00 = tcu::TestContext::getLog(pTVar3);
    ReferenceRenderer::getAccess
              ((PixelBufferAccess *)&local_7c0,
               (ReferenceRenderer *)&renderState.restart.restartIndex);
    bVar1 = tcu::fuzzyCompare(log_00,"FuzzyImageCompare","Image comparison",&local_7c0,
                              _minUniqueColors,0.05,COMPARE_LOG_RESULT);
    bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7e0,"Primitive has unexpected shape",&local_7e1);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_7e0);
      std::__cxx11::string::~string((string *)&local_7e0);
      std::allocator<char>::~allocator(&local_7e1);
    }
    local_7e8 = (uint)bVar1;
    ReferenceRenderer::~ReferenceRenderer((ReferenceRenderer *)&renderState.restart.restartIndex);
    ColorFragmentShader::~ColorFragmentShader((ColorFragmentShader *)&program.geometryShader);
    ColorVertexShader::~ColorVertexShader((ColorVertexShader *)&fragmentShader.m_depthStencilFormat)
    ;
    if (local_7e8 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_808,"Primitive rendered, unique colors within expected bounds",
                 &local_809);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_808);
      std::__cxx11::string::~string((string *)&local_808);
      std::allocator<char>::~allocator(&local_809);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus RasterizationSamplesInstance::verifyImage (const tcu::ConstPixelBufferAccess& result)
{
	// Verify range of unique pixels
	{
		const deUint32	numUniqueColors = getUniqueColorsCount(result);
		const deUint32	minUniqueColors	= 3;

		tcu::TestLog& log = m_context.getTestContext().getLog();

		log << tcu::TestLog::Message
			<< "\nMin. unique colors expected: " << minUniqueColors << "\n"
			<< "Unique colors found: " << numUniqueColors << "\n"
			<< tcu::TestLog::EndMessage;

		if (numUniqueColors < minUniqueColors)
			return tcu::TestStatus::fail("Unique colors out of expected bounds");
	}

	// Verify shape of the rendered primitive (fuzzy-compare)
	{
		const tcu::TextureFormat	tcuColorFormat	= mapVkFormat(m_colorFormat);
		const tcu::TextureFormat	tcuDepthFormat	= tcu::TextureFormat();
		const ColorVertexShader		vertexShader;
		const ColorFragmentShader	fragmentShader	(tcuColorFormat, tcuDepthFormat);
		const rr::Program			program			(&vertexShader, &fragmentShader);
		ReferenceRenderer			refRenderer		(m_renderSize.x(), m_renderSize.y(), 1, tcuColorFormat, tcuDepthFormat, &program);
		rr::RenderState				renderState		(refRenderer.getViewportState());

		if (m_primitiveTopology == VK_PRIMITIVE_TOPOLOGY_POINT_LIST)
		{
			VkPhysicalDeviceProperties deviceProperties;

			m_context.getInstanceInterface().getPhysicalDeviceProperties(m_context.getPhysicalDevice(), &deviceProperties);

			// gl_PointSize is clamped to pointSizeRange
			renderState.point.pointSize = deFloatMin(3.0f, deviceProperties.limits.pointSizeRange[1]);
		}

		if (m_modeFlags == 0)
		{
			refRenderer.colorClear(tcu::Vec4(0.0f));
			refRenderer.draw(renderState, mapVkPrimitiveTopology(m_primitiveTopology), m_vertices);
		}
		else
		{
			// For depth/stencil case the primitive is invisible and the surroundings are filled red.
			refRenderer.colorClear(tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f));
			refRenderer.draw(renderState, mapVkPrimitiveTopology(m_primitiveTopology), m_vertices);
		}

		if (!tcu::fuzzyCompare(m_context.getTestContext().getLog(), "FuzzyImageCompare", "Image comparison", refRenderer.getAccess(), result, 0.05f, tcu::COMPARE_LOG_RESULT))
			return tcu::TestStatus::fail("Primitive has unexpected shape");
	}

	return tcu::TestStatus::pass("Primitive rendered, unique colors within expected bounds");
}